

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void relstack(lua_State *L)

{
  UpVal *local_20;
  UpVal *up;
  CallInfo *ci;
  lua_State *L_local;
  
  (L->top).p = (StkId)((long)(L->top).p - (L->stack).offset);
  (L->tbclist).p = (StkId)((long)(L->tbclist).p - (L->stack).offset);
  for (local_20 = L->openupval; local_20 != (UpVal *)0x0; local_20 = (local_20->u).open.next) {
    (local_20->v).p = (TValue *)((long)(local_20->v).p - (L->stack).offset);
  }
  for (up = (UpVal *)L->ci; up != (UpVal *)0x0; up = (UpVal *)(up->v).p) {
    *(long *)&up->tt = *(long *)&up->tt - (L->stack).offset;
    up->next = (GCObject *)((long)up->next - (L->stack).offset);
  }
  return;
}

Assistant:

static void relstack (lua_State *L) {
  CallInfo *ci;
  UpVal *up;
  L->top.offset = savestack(L, L->top.p);
  L->tbclist.offset = savestack(L, L->tbclist.p);
  for (up = L->openupval; up != NULL; up = up->u.open.next)
    up->v.offset = savestack(L, uplevel(up));
  for (ci = L->ci; ci != NULL; ci = ci->previous) {
    ci->top.offset = savestack(L, ci->top.p);
    ci->func.offset = savestack(L, ci->func.p);
  }
}